

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

int xmlOutputBufferFlush(xmlOutputBufferPtr out)

{
  xmlOutputWriteCallback p_Var1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  xmlChar *pxVar5;
  size_t sVar6;
  xmlBufPtr *ppxVar7;
  
  if (out == (xmlOutputBufferPtr)0x0) {
    return -1;
  }
  if (out->error != 0) {
    return -1;
  }
  if ((out->conv == (xmlBufPtr)0x0) || (out->encoder == (xmlCharEncodingHandlerPtr)0x0)) {
LAB_0015e670:
    p_Var1 = out->writecallback;
    if (p_Var1 == (xmlOutputWriteCallback)0x0) {
      uVar4 = 0;
      goto LAB_0015e6b8;
    }
    pvVar2 = out->context;
    pxVar5 = xmlBufContent(out->buffer);
    sVar6 = xmlBufUse(out->buffer);
    uVar4 = (*p_Var1)(pvVar2,(char *)pxVar5,(int)sVar6);
    if ((int)uVar4 < 0) {
LAB_0015e6d3:
      iVar3 = 0x60a;
      if (uVar4 != 0xffffffff) {
        iVar3 = -uVar4;
      }
      out->error = iVar3;
      return uVar4;
    }
    ppxVar7 = &out->buffer;
  }
  else {
    ppxVar7 = &out->conv;
    do {
      iVar3 = xmlCharEncOutput(out,0);
      if (iVar3 < 0) {
        return -1;
      }
    } while (iVar3 != 0);
    if (((*ppxVar7 == (xmlBuf *)0x0) || (out->encoder == (xmlCharEncodingHandlerPtr)0x0)) ||
       (p_Var1 = out->writecallback, p_Var1 == (xmlOutputWriteCallback)0x0)) goto LAB_0015e670;
    pvVar2 = out->context;
    pxVar5 = xmlBufContent(*ppxVar7);
    sVar6 = xmlBufUse(out->conv);
    uVar4 = (*p_Var1)(pvVar2,(char *)pxVar5,(int)sVar6);
    if ((int)uVar4 < 0) goto LAB_0015e6d3;
  }
  xmlBufShrink(*ppxVar7,(ulong)uVar4);
LAB_0015e6b8:
  iVar3 = out->written + uVar4;
  if ((int)(uVar4 ^ 0x7fffffff) < out->written) {
    iVar3 = 0x7fffffff;
  }
  out->written = iVar3;
  return uVar4;
}

Assistant:

int
xmlOutputBufferFlush(xmlOutputBufferPtr out) {
    int nbchars = 0, ret = 0;

    if ((out == NULL) || (out->error)) return(-1);
    /*
     * first handle encoding stuff.
     */
    if ((out->conv != NULL) && (out->encoder != NULL)) {
	/*
	 * convert as much as possible to the parser output buffer.
	 */
	do {
	    nbchars = xmlCharEncOutput(out, 0);
	    if (nbchars < 0)
		return(-1);
	} while (nbchars);
    }

    /*
     * second flush the stuff to the I/O channel
     */
    if ((out->conv != NULL) && (out->encoder != NULL) &&
	(out->writecallback != NULL)) {
	ret = out->writecallback(out->context,
                                 (const char *)xmlBufContent(out->conv),
                                 xmlBufUse(out->conv));
	if (ret >= 0)
	    xmlBufShrink(out->conv, ret);
    } else if (out->writecallback != NULL) {
	ret = out->writecallback(out->context,
                                 (const char *)xmlBufContent(out->buffer),
                                 xmlBufUse(out->buffer));
	if (ret >= 0)
	    xmlBufShrink(out->buffer, ret);
    }
    if (ret < 0) {
        out->error = (ret == -1) ? XML_IO_WRITE : -ret;
	return(ret);
    }
    if (out->written > INT_MAX - ret)
        out->written = INT_MAX;
    else
        out->written += ret;

    return(ret);
}